

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

long proto2num(Configurable *config,long *val,char *str)

{
  byte bVar1;
  int iVar2;
  char *__s;
  byte *first;
  ushort **ppuVar3;
  ulong uVar4;
  sprotos *psVar5;
  char *second;
  long lVar6;
  int iVar7;
  
  lVar6 = 1;
  if ((str != (char *)0x0) && (__s = strdup(str), __s != (char *)0x0)) {
    first = (byte *)strtok(__s,",");
    if (first == (byte *)0x0) {
      lVar6 = 0;
    }
    else {
      ppuVar3 = __ctype_b_loc();
      lVar6 = 0;
      do {
        uVar4 = (ulong)*first;
        iVar7 = 0;
        bVar1 = (byte)(*ppuVar3)[uVar4];
        while ((bVar1 & 8) == 0) {
          if ((char)uVar4 == '+') {
            iVar7 = 0;
          }
          else {
            iVar7 = 2;
            if ((int)uVar4 != 0x3d) {
              if ((int)uVar4 != 0x2d) {
                lVar6 = 1;
                goto LAB_00110c40;
              }
              iVar7 = 1;
            }
          }
          first = first + 1;
          uVar4 = (ulong)*first;
          bVar1 = (byte)(*ppuVar3)[uVar4];
        }
        psVar5 = proto2num::protos;
        second = "all";
        do {
          psVar5 = psVar5 + 1;
          iVar2 = Curl_raw_equal((char *)first,second);
          if (iVar2 != 0) {
            uVar4 = psVar5[-1].bit;
            if (iVar7 == 0) {
              *val = *val | uVar4;
            }
            else if (iVar7 == 2) {
              *val = uVar4;
            }
            else {
              *val = *val & ~uVar4;
            }
            goto LAB_00110c19;
          }
          second = psVar5->name;
        } while (second != (char *)0x0);
        if (iVar7 == 2) {
          *val = 0;
        }
        warnf(config,"unrecognized protocol \'%s\'\n",first);
LAB_00110c19:
        first = (byte *)strtok((char *)0x0,",");
      } while (first != (byte *)0x0);
    }
LAB_00110c40:
    free(__s);
  }
  return lVar6;
}

Assistant:

long proto2num(struct Configurable *config, long *val, const char *str)
{
  char *buffer;
  const char *sep = ",";
  char *token;

  static struct sprotos {
    const char *name;
    long bit;
  } const protos[] = {
    { "all", CURLPROTO_ALL },
    { "http", CURLPROTO_HTTP },
    { "https", CURLPROTO_HTTPS },
    { "ftp", CURLPROTO_FTP },
    { "ftps", CURLPROTO_FTPS },
    { "scp", CURLPROTO_SCP },
    { "sftp", CURLPROTO_SFTP },
    { "telnet", CURLPROTO_TELNET },
    { "ldap", CURLPROTO_LDAP },
    { "ldaps", CURLPROTO_LDAPS },
    { "dict", CURLPROTO_DICT },
    { "file", CURLPROTO_FILE },
    { "tftp", CURLPROTO_TFTP },
    { "imap", CURLPROTO_IMAP },
    { "imaps", CURLPROTO_IMAPS },
    { "pop3", CURLPROTO_POP3 },
    { "pop3s", CURLPROTO_POP3S },
    { "smtp", CURLPROTO_SMTP },
    { "smtps", CURLPROTO_SMTPS },
    { "rtsp", CURLPROTO_RTSP },
    { "gopher", CURLPROTO_GOPHER },
    { NULL, 0 }
  };

  if(!str)
    return 1;

  buffer = strdup(str); /* because strtok corrupts it */
  if(!buffer)
    return 1;

  for(token = strtok(buffer, sep);
      token;
      token = strtok(NULL, sep)) {
    enum e_action { allow, deny, set } action = allow;

    struct sprotos const *pp;

    /* Process token modifiers */
    while(!ISALNUM(*token)) { /* may be NULL if token is all modifiers */
      switch (*token++) {
      case '=':
        action = set;
        break;
      case '-':
        action = deny;
        break;
      case '+':
        action = allow;
        break;
      default: /* Includes case of terminating NULL */
        Curl_safefree(buffer);
        return 1;
      }
    }

    for(pp=protos; pp->name; pp++) {
      if(curlx_raw_equal(token, pp->name)) {
        switch (action) {
        case deny:
          *val &= ~(pp->bit);
          break;
        case allow:
          *val |= pp->bit;
          break;
        case set:
          *val = pp->bit;
          break;
        }
        break;
      }
    }

    if(!(pp->name)) { /* unknown protocol */
      /* If they have specified only this protocol, we say treat it as
         if no protocols are allowed */
      if(action == set)
        *val = 0;
      warnf(config, "unrecognized protocol '%s'\n", token);
    }
  }
  Curl_safefree(buffer);
  return 0;
}